

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_Layer * __thiscall ON_ClassArray<ON_Layer>::AppendNew(ON_ClassArray<ON_Layer> *this)

{
  int iVar1;
  long lVar2;
  
  if (*(int *)(this + 0x10) == *(int *)(this + 0x14)) {
    iVar1 = NewCapacity(this);
    Reserve(this,(long)iVar1);
  }
  else {
    lVar2 = (long)*(int *)(this + 0x10) * 0xe8;
    (**(code **)(*(long *)(*(long *)(this + 8) + lVar2) + 0x18))(*(long *)(this + 8) + lVar2);
    ON_Layer::ON_Layer((ON_Layer *)((long)*(int *)(this + 0x10) * 0xe8 + *(long *)(this + 8)));
  }
  iVar1 = *(int *)(this + 0x10);
  *(int *)(this + 0x10) = iVar1 + 1;
  return (ON_Layer *)((long)iVar1 * 0xe8 + *(long *)(this + 8));
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}